

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_switch_at(Curl_cfilter *cf,Curl_easy *data)

{
  _Bool local_2d;
  CURLcode local_2c;
  _Bool done;
  Curl_cfilter *pCStack_28;
  CURLcode result;
  Curl_cfilter *cf_h2;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  cf_h2 = (Curl_cfilter *)data;
  data_local = (Curl_easy *)cf;
  local_2c = http2_cfilter_insert_after(cf,data);
  cf_local._4_4_ = local_2c;
  if (local_2c == CURLE_OK) {
    pCStack_28 = (Curl_cfilter *)data_local->id;
    local_2c = cf_h2_ctx_init(pCStack_28,(Curl_easy *)cf_h2,false);
    cf_local._4_4_ = local_2c;
    if (local_2c == CURLE_OK) {
      (data_local->prev->set).mimepost.encstate.buf[0xb0] = '\x14';
      *(uint *)&(data_local->prev->set).hsts_write =
           *(uint *)&(data_local->prev->set).hsts_write & 0xff7fffff | 0x800000;
      **(undefined4 **)((data_local->prev->set).mimepost.encstate.buf + 0x80) = 2;
      Curl_multi_connchanged(*(Curl_multi **)&cf_h2[4].sockindex);
      if (pCStack_28->next == (Curl_cfilter *)0x0) {
        cf_local._4_4_ = CURLE_OK;
      }
      else {
        cf_local._4_4_ = Curl_conn_cf_connect(pCStack_28,(Curl_easy *)cf_h2,false,&local_2d);
      }
    }
  }
  return cf_local._4_4_;
}

Assistant:

CURLcode Curl_http2_switch_at(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct Curl_cfilter *cf_h2;
  CURLcode result;

  DEBUGASSERT(!Curl_cf_is_http2(cf, data));

  result = http2_cfilter_insert_after(cf, data);
  if(result)
    return result;

  cf_h2 = cf->next;
  result = cf_h2_ctx_init(cf_h2, data, FALSE);
  if(result)
    return result;

  cf->conn->httpversion = 20; /* we know we're on HTTP/2 now */
  cf->conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  cf->conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  Curl_multi_connchanged(data->multi);

  if(cf_h2->next) {
    bool done;
    return Curl_conn_cf_connect(cf_h2, data, FALSE, &done);
  }
  return CURLE_OK;
}